

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*>::DoCopy
          (TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*> *this,
          TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*> *other)

{
  uint uVar1;
  PClassPlayerPawn **ppPVar2;
  uint local_1c;
  uint i;
  TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*> *other_local;
  TArray<PClassPlayerPawn_*,_PClassPlayerPawn_*> *this_local;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if (this->Count == 0) {
    this->Array = (PClassPlayerPawn **)0x0;
  }
  else {
    ppPVar2 = (PClassPlayerPawn **)
              M_Malloc_Dbg((ulong)this->Most << 3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                           ,0x199);
    this->Array = ppPVar2;
    for (local_1c = 0; local_1c < this->Count; local_1c = local_1c + 1) {
      this->Array[local_1c] = other->Array[local_1c];
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}